

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackCase::iterate(VertexFeedbackCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  Enum<int,_2UL> EVar8;
  MessageBuilder local_d90;
  GetNameFunc local_c10;
  int local_c08;
  Enum<int,_2UL> local_c00;
  MessageBuilder local_bf0;
  undefined4 local_a6c;
  undefined4 local_a68;
  DrawElementsIndirectCommand params_1;
  Enum<int,_2UL> local_a48;
  MessageBuilder local_a38;
  undefined4 local_8b8;
  undefined4 local_8b4;
  DrawArraysIndirectCommand params;
  Enum<int,_2UL> local_898;
  MessageBuilder local_888;
  GetNameFunc local_708;
  int local_700;
  Enum<int,_2UL> local_6f8;
  MessageBuilder local_6e8;
  GetNameFunc local_568;
  int local_560;
  Enum<int,_2UL> local_558;
  MessageBuilder local_548;
  GetNameFunc local_3c8;
  int local_3c0;
  Enum<int,_2UL> local_3b8;
  MessageBuilder local_3a8;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  MessageBuilder local_208;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  int local_28;
  int local_24;
  int offsetLocation;
  int posLocation;
  deUint32 basePrimitive;
  deUint32 outputPrimitive;
  Functions *gl;
  VertexFeedbackCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _basePrimitive = CONCAT44(extraout_var,iVar2);
  posLocation = getOutputPrimitive(this);
  offsetLocation = getBasePrimitive(this);
  pcVar1 = *(code **)(_basePrimitive + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  local_24 = (*pcVar1)(dVar3,"a_position");
  pcVar1 = *(code **)(_basePrimitive + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  local_28 = (*pcVar1)(dVar3,"a_offset");
  if (local_24 == -1) {
    local_5d = 1;
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"a_position location was -1",&local_49);
    tcu::TestError::TestError(pTVar5,&local_48);
    local_5d = 0;
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_28 != -1) {
    pcVar1 = *(code **)(_basePrimitive + 0x1680);
    dVar3 = glu::ShaderProgram::getProgram(this->m_program);
    (*pcVar1)(dVar3);
    (**(code **)(_basePrimitive + 0x40))(0x8892,this->m_arrayBuf);
    (**(code **)(_basePrimitive + 0x19f0))(local_24,4,0x1406,0);
    (**(code **)(_basePrimitive + 0x610))(local_24);
    (**(code **)(_basePrimitive + 0x40))(0x8892,this->m_offsetBuf);
    (**(code **)(_basePrimitive + 0x19f0))(local_28,4,0x1406,0,0,0);
    (**(code **)(_basePrimitive + 0x610))(local_28);
    (**(code **)(_basePrimitive + 0x48))(0x8c8e,0,this->m_feedbackBuf);
    dVar3 = (**(code **)(_basePrimitive + 0x800))();
    glu::checkError(dVar3,"bind buffer base",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x15e4);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_208,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_208,(char (*) [32])"Calling BeginTransformFeedback(");
    EVar8 = glu::getPrimitiveTypeStr(offsetLocation);
    local_228 = EVar8.m_getName;
    local_220 = EVar8.m_value;
    local_218.m_getName = local_228;
    local_218.m_value = local_220;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_218);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a85ff4);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_208);
    (**(code **)(_basePrimitive + 0x30))(offsetLocation);
    dVar3 = (**(code **)(_basePrimitive + 0x800))();
    glu::checkError(dVar3,"beginTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x15e8);
    switch(this->m_method) {
    case METHOD_DRAW_ARRAYS:
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3a8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_3a8,(char (*) [20])"Calling DrawArrays(");
      EVar8 = glu::getPrimitiveTypeStr(posLocation);
      local_3c8 = EVar8.m_getName;
      local_3c0 = EVar8.m_value;
      local_3b8.m_getName = local_3c8;
      local_3b8.m_value = local_3c0;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3b8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a4474e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a8);
      (**(code **)(_basePrimitive + 0x538))(posLocation,0,4);
      break;
    case METHOD_DRAW_ARRAYS_INSTANCED:
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_548,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_548,(char (*) [29])"Calling DrawArraysInstanced(");
      EVar8 = glu::getPrimitiveTypeStr(posLocation);
      local_568 = EVar8.m_getName;
      local_560 = EVar8.m_value;
      local_558.m_getName = local_568;
      local_558.m_value = local_560;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_558);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a4474e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_548);
      (**(code **)(_basePrimitive + 0x18a0))(local_28,2);
      (**(code **)(_basePrimitive + 0x548))(posLocation,0,3,2);
      break;
    case METHOD_DRAW_ARRAYS_INDIRECT:
      local_8b8 = 4;
      local_8b4 = 1;
      params.count = 0;
      params.instanceCount = 0;
      (**(code **)(_basePrimitive + 0x6c8))(1,&this->m_indirectBuffer);
      (**(code **)(_basePrimitive + 0x40))(0x8f3f,this->m_indirectBuffer);
      (**(code **)(_basePrimitive + 0x150))(0x8f3f,0x10,&local_8b8,0x88e4);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_a38,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_a38,(char (*) [30])"Calling DrawElementsIndirect(");
      EVar8 = glu::getPrimitiveTypeStr(posLocation);
      params_1._12_8_ = EVar8.m_getName;
      local_a48.m_value = EVar8.m_value;
      local_a48.m_getName = (GetNameFunc)params_1._12_8_;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a48);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a4474e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a38);
      (**(code **)(_basePrimitive + 0x540))(posLocation,0);
      break;
    case METHOD_DRAW_ELEMENTS:
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_6e8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_6e8,(char (*) [22])"Calling DrawElements(");
      EVar8 = glu::getPrimitiveTypeStr(posLocation);
      local_708 = EVar8.m_getName;
      local_700 = EVar8.m_value;
      local_6f8.m_getName = local_708;
      local_6f8.m_value = local_700;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_6f8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a4474e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6e8);
      (**(code **)(_basePrimitive + 0x568))(posLocation,4,0x1403,0);
      break;
    case METHOD_DRAW_ELEMENTS_INSTANCED:
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_888,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_888,(char (*) [31])"Calling DrawElementsInstanced(");
      EVar8 = glu::getPrimitiveTypeStr(posLocation);
      params._8_8_ = EVar8.m_getName;
      local_898.m_value = EVar8.m_value;
      local_898.m_getName = (GetNameFunc)params._8_8_;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_898);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a4474e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_888);
      (**(code **)(_basePrimitive + 0x580))(posLocation,3,0x1403,0,2);
      break;
    case METHOD_DRAW_ELEMENTS_INDIRECT:
      local_a6c = 4;
      local_a68 = 1;
      params_1.count = 0;
      params_1.instanceCount = 0;
      params_1.firstIndex = 0;
      (**(code **)(_basePrimitive + 0x6c8))(1,&this->m_indirectBuffer);
      (**(code **)(_basePrimitive + 0x40))(0x8f3f,this->m_indirectBuffer);
      (**(code **)(_basePrimitive + 0x150))(0x8f3f,0x14,&local_a6c,0x88e4);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_bf0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_bf0,(char (*) [30])"Calling DrawElementsIndirect(");
      EVar8 = glu::getPrimitiveTypeStr(posLocation);
      local_c10 = EVar8.m_getName;
      local_c08 = EVar8.m_value;
      local_c00.m_getName = local_c10;
      local_c00.m_value = local_c08;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c00);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a4474e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_bf0);
      (**(code **)(_basePrimitive + 0x578))(posLocation,0x1403,0);
    }
    dVar3 = (**(code **)(_basePrimitive + 0x800))();
    glu::checkError(dVar3,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x1642);
    (**(code **)(_basePrimitive + 0x638))();
    dVar3 = (**(code **)(_basePrimitive + 0x800))();
    glu::checkError(dVar3,"endTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x1645);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_d90,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_d90,(char (*) [11])"No errors.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d90);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return STOP;
  }
  local_82 = 1;
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"a_offset location was -1",&local_81);
  tcu::TestError::TestError(pTVar5,&local_80);
  local_82 = 0;
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

VertexFeedbackCase::IterateResult VertexFeedbackCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			outputPrimitive	= getOutputPrimitive();
	const deUint32			basePrimitive	= getBasePrimitive();

	const int				posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				offsetLocation	= gl.getAttribLocation(m_program->getProgram(), "a_offset");

	if (posLocation == -1)
		throw tcu::TestError("a_position location was -1");
	if (offsetLocation == -1)
		throw tcu::TestError("a_offset location was -1");

	gl.useProgram(m_program->getProgram());

	gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(posLocation);

	gl.bindBuffer(GL_ARRAY_BUFFER, m_offsetBuf);
	gl.vertexAttribPointer(offsetLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(offsetLocation);

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_feedbackBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffer base");

	m_testCtx.getLog() << tcu::TestLog::Message << "Calling BeginTransformFeedback(" << glu::getPrimitiveTypeStr(basePrimitive) << ")" << tcu::TestLog::EndMessage;
	gl.beginTransformFeedback(basePrimitive);
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	switch (m_method)
	{
		case METHOD_DRAW_ARRAYS:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawArrays(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawArrays(outputPrimitive, 0, 4);
			break;
		}

		case METHOD_DRAW_ARRAYS_INSTANCED:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawArraysInstanced(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.vertexAttribDivisor(offsetLocation, 2);
			gl.drawArraysInstanced(outputPrimitive, 0, 3, 2);
			break;
		}

		case METHOD_DRAW_ELEMENTS:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElements(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawElements(outputPrimitive, 4, GL_UNSIGNED_SHORT, DE_NULL);
			break;
		}

		case METHOD_DRAW_ELEMENTS_INSTANCED:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElementsInstanced(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawElementsInstanced(outputPrimitive, 3, GL_UNSIGNED_SHORT, DE_NULL, 2);
			break;
		}

		case METHOD_DRAW_ARRAYS_INDIRECT:
		{
			struct DrawArraysIndirectCommand
			{
				deUint32 count;
				deUint32 instanceCount;
				deUint32 first;
				deUint32 reservedMustBeZero;
			} params;

			DE_STATIC_ASSERT(sizeof(DrawArraysIndirectCommand) == sizeof(deUint32[4]));

			params.count = 4;
			params.instanceCount = 1;
			params.first = 0;
			params.reservedMustBeZero = 0;

			gl.genBuffers(1, &m_indirectBuffer);
			gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, m_indirectBuffer);
			gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(params), &params, GL_STATIC_DRAW);

			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElementsIndirect(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawArraysIndirect(outputPrimitive, DE_NULL);
			break;
		}

		case METHOD_DRAW_ELEMENTS_INDIRECT:
		{
			struct DrawElementsIndirectCommand
			{
				deUint32	count;
				deUint32	instanceCount;
				deUint32	firstIndex;
				deInt32		baseVertex;
				deUint32	reservedMustBeZero;
			} params;

			DE_STATIC_ASSERT(sizeof(DrawElementsIndirectCommand) == sizeof(deUint32[5]));

			params.count = 4;
			params.instanceCount = 1;
			params.firstIndex = 0;
			params.baseVertex = 0;
			params.reservedMustBeZero = 0;

			gl.genBuffers(1, &m_indirectBuffer);
			gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, m_indirectBuffer);
			gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(params), &params, GL_STATIC_DRAW);

			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElementsIndirect(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawElementsIndirect(outputPrimitive, GL_UNSIGNED_SHORT, DE_NULL);
			break;
		}

		default:
			DE_ASSERT(false);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "endTransformFeedback");

	m_testCtx.getLog() << tcu::TestLog::Message << "No errors." << tcu::TestLog::EndMessage;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}